

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

bool __thiscall
pbrt::Curve::IntersectRay(Curve *this,Ray *r,Float tMax,optional<pbrt::ShapeIntersection> *si)

{
  Float FVar1;
  uint uVar2;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  Transform *this_00;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  size_t in_RCX;
  long extraout_RDX;
  long in_FS_OFFSET;
  byte bVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar47 [48];
  undefined1 auVar31 [64];
  undefined1 auVar33 [64];
  undefined1 auVar23 [16];
  undefined1 auVar35 [64];
  undefined1 auVar37 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar39 [64];
  undefined1 auVar41 [64];
  undefined1 auVar43 [64];
  undefined1 auVar45 [64];
  float fVar48;
  float fVar49;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  array<pbrt::Point3<float>,_4> cpObj;
  array<pbrt::Point3<float>,_4> cp;
  Transform rayFromObject;
  Tuple3<pbrt::Vector3,_float> local_220;
  float local_214;
  uint local_210;
  uint local_20c;
  array<pbrt::Point3<float>,_4> local_208;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  Ray local_180;
  Tuple3<pbrt::Point3,_float> local_158;
  uint uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined8 uStack_140;
  undefined4 local_138;
  uint local_134;
  undefined4 uStack_130;
  float local_12c;
  undefined1 local_128 [12];
  float fStack_11c;
  Interval<float> IStack_118;
  Float FStack_110;
  float fStack_10c;
  Float FStack_108;
  Float FStack_104;
  Float FStack_100;
  float fStack_fc;
  Float FStack_f8;
  float fStack_f4;
  Float FStack_f0;
  Float FStack_ec;
  Interval<float> IStack_d8;
  Float aFStack_d0 [2];
  Float aFStack_c8 [2];
  Float aFStack_c0 [2];
  Float aFStack_b8 [2];
  Float aFStack_b0 [2];
  undefined1 local_a8 [24];
  Float aFStack_90 [2];
  Float aFStack_88 [2];
  Float aFStack_80 [2];
  Float aFStack_78 [2];
  Float aFStack_70 [2];
  Float local_68 [2];
  Float aFStack_60 [2];
  Interval<float> IStack_58;
  uint uVar3;
  undefined1 auVar32 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar47 = in_ZmmResult._16_48_;
  *(long *)(in_FS_OFFSET + -0x650) = *(long *)(in_FS_OFFSET + -0x650) + 1;
  fVar60 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._4_4_ = fVar60;
  auVar18._0_4_ = fVar60;
  auVar18._8_4_ = fVar60;
  auVar18._12_4_ = fVar60;
  this_00 = this->common->objectFromRender;
  fVar60 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar17._4_4_ = fVar60;
  auVar17._0_4_ = fVar60;
  auVar17._8_4_ = fVar60;
  auVar17._12_4_ = fVar60;
  local_a8._0_16_ = vmovlhps_avx(auVar18,auVar17);
  fVar60 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19._4_4_ = fVar60;
  auVar19._0_4_ = fVar60;
  auVar19._8_4_ = fVar60;
  auVar19._12_4_ = fVar60;
  local_a8._16_8_ = vmovlps_avx(auVar19);
  Transform::operator()((Point3fi *)local_128,this_00,(Point3fi *)local_a8);
  fVar60 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar64 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar48 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * (this_00->m).m[0][1])),ZEXT416((uint)fVar60),
                            ZEXT416((uint)(this_00->m).m[0][0]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar48),ZEXT416((uint)(this_00->m).m[0][2]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * (this_00->m).m[1][1])),ZEXT416((uint)fVar60),
                            ZEXT416((uint)(this_00->m).m[1][0]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar48),ZEXT416((uint)(this_00->m).m[1][2]));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * (this_00->m).m[2][1])),ZEXT416((uint)fVar60),
                            ZEXT416((uint)(this_00->m).m[2][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar48),ZEXT416((uint)(this_00->m).m[2][2]));
  fVar60 = auVar17._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60)),auVar18,auVar18);
  auVar20 = vfmadd231ss_fma(auVar20,auVar19,auVar19);
  if (0.0 < auVar20._0_4_) {
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx(auVar18,auVar23);
    auVar22 = vandps_avx(auVar17,auVar23);
    auVar23 = vandps_avx(auVar19,auVar23);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar21);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT816(0) << 0x40,auVar23);
    fVar48 = auVar21._0_4_ / auVar20._0_4_;
    fVar64 = auVar18._0_4_ * fVar48;
    local_1d8 = ZEXT416((uint)(fVar60 * fVar48));
    local_1c8 = ZEXT416((uint)(auVar19._0_4_ * fVar48));
    i.high = fVar64;
    i.low = fVar64;
    local_1b8 = auVar17;
    local_1a8 = auVar18;
    local_198 = auVar19;
    auVar51._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_128,i);
    auVar51._8_56_ = extraout_var;
    uVar15 = vmovlps_avx(auVar51._0_16_);
    local_128._0_4_ = (undefined4)uVar15;
    local_128._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
    i_00.high = (float)local_1d8._0_4_;
    i_00.low = (float)local_1d8._0_4_;
    auVar52._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_128 + 8),i_00);
    auVar52._8_56_ = extraout_var_00;
    uVar15 = vmovlps_avx(auVar52._0_16_);
    local_128._8_4_ = (undefined4)uVar15;
    fStack_11c = (float)((ulong)uVar15 >> 0x20);
    i_01.high = (float)local_1c8._0_4_;
    i_01.low = (float)local_1c8._0_4_;
    auVar53._0_8_ = Interval<float>::operator+<float>(&IStack_118,i_01);
    auVar53._8_56_ = extraout_var_01;
    IStack_118 = (Interval<float>)vmovlps_avx(auVar53._0_16_);
    auVar18 = local_1a8;
    auVar17 = local_1b8;
    auVar19 = local_198;
  }
  auVar18 = vinsertps_avx(auVar18,auVar17,0x10);
  auVar21._4_4_ = local_128._4_4_;
  auVar21._0_4_ = local_128._0_4_;
  auVar21._8_4_ = local_128._8_4_;
  auVar21._12_4_ = fStack_11c;
  local_180.o.super_Tuple3<pbrt::Point3,_float>.z = (IStack_118.low + IStack_118.high) * 0.5;
  local_180.time = r->time;
  local_180.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar17 = vinsertps_avx(auVar21,ZEXT416((uint)fStack_11c),0x10);
  auVar22._0_4_ = (float)local_128._4_4_ + auVar17._0_4_;
  auVar22._4_4_ = (float)local_128._8_4_ + auVar17._4_4_;
  auVar22._8_4_ = auVar17._8_4_ + 0.0;
  auVar22._12_4_ = auVar17._12_4_ + 0.0;
  auVar20._8_4_ = 0x3f000000;
  auVar20._0_8_ = 0x3f0000003f000000;
  auVar20._12_4_ = 0x3f000000;
  auVar17 = vmulps_avx512vl(auVar22,auVar20);
  local_180.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar17);
  local_180.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar18);
  local_180.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar19._0_4_;
  cp_00.n = in_RCX;
  cp_00.ptr = (Point3<float> *)0x4;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (&local_208,(pbrt *)this->common->cpObj,cp_00,this->uMin,this->uMax);
  fVar60 = local_208.values[3].super_Tuple3<pbrt::Point3,_float>.x -
           local_208.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  fVar64 = local_208.values[3].super_Tuple3<pbrt::Point3,_float>.y -
           local_208.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  fVar48 = local_208.values[3].super_Tuple3<pbrt::Point3,_float>.z -
           local_208.values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar22 = ZEXT416((uint)local_180.d.super_Tuple3<pbrt::Vector3,_float>.z);
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)fVar64),auVar22,
                             ZEXT416((uint)(fVar64 * local_180.d.super_Tuple3<pbrt::Vector3,_float>.
                                                     z)));
  auVar24._8_8_ = 0;
  auVar24._0_4_ = local_180.d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar24._4_4_ = local_180.d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar17 = vmovshdup_avx(auVar24);
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar64 * local_180.d.super_Tuple3<pbrt::Vector3,_float>.z
                                          )),auVar17,ZEXT416((uint)fVar48));
  fVar49 = local_180.d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar60),auVar22,ZEXT416((uint)(fVar48 * fVar49)));
  auVar21 = vfnmadd213ss_fma(ZEXT416((uint)fVar48),auVar24,ZEXT416((uint)(fVar48 * fVar49)));
  auVar18 = vinsertps_avx(ZEXT416((uint)(auVar19._0_4_ + auVar20._0_4_)),
                          ZEXT416((uint)(auVar18._0_4_ + auVar21._0_4_)),0x10);
  auVar20 = ZEXT416((uint)(fVar60 * auVar17._0_4_));
  auVar19 = vfmsub213ss_fma(ZEXT416((uint)fVar64),auVar24,auVar20);
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)fVar60),auVar17,auVar20);
  local_220.z = auVar20._0_4_ + auVar19._0_4_;
  local_220._0_8_ = vmovlps_avx(auVar18);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_220.y * local_220.y)),ZEXT416((uint)local_220.x),
                            ZEXT416((uint)local_220.x));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_220.z),ZEXT416((uint)local_220.z));
  bVar13 = NAN(auVar18._0_4_);
  bVar14 = auVar18._0_4_ == 0.0;
  if (((bool)bVar14) && (!bVar13)) {
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    auVar26._8_4_ = 0x80000000;
    auVar26._0_8_ = 0x8000000080000000;
    auVar26._12_4_ = 0x80000000;
    auVar18 = vpternlogd_avx512vl(auVar25,auVar22,auVar26,0xf8);
    fVar60 = auVar18._0_4_;
    fVar64 = -1.0 / (local_180.d.super_Tuple3<pbrt::Vector3,_float>.z + fVar60);
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(fVar49 * fVar60 * fVar49)),ZEXT416((uint)fVar64),
                              auVar25);
    local_220.z = fVar49 * -fVar60;
    local_220.y = fVar60 * auVar17._0_4_ * fVar49 * fVar64;
    local_220.x = auVar18._0_4_;
  }
  auVar54._0_4_ = fVar49 + local_180.o.super_Tuple3<pbrt::Point3,_float>.x;
  auVar54._4_4_ =
       local_180.d.super_Tuple3<pbrt::Vector3,_float>.y +
       local_180.o.super_Tuple3<pbrt::Point3,_float>.y;
  auVar54._8_8_ = 0;
  uVar15 = vmovlps_avx(auVar54);
  local_a8._8_4_ =
       local_180.d.super_Tuple3<pbrt::Vector3,_float>.z +
       local_180.o.super_Tuple3<pbrt::Point3,_float>.z;
  local_a8._0_8_ = uVar15;
  LookAt((Transform *)local_128,&local_180.o,(Point3f *)local_a8,(Vector3f *)&local_220);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_208.values[0].super_Tuple3<pbrt::Point3,_float>.y *
                                          (float)local_128._4_4_)),ZEXT416((uint)local_128._0_4_),
                            ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_128._8_4_),
                                ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar17 = vaddss_avx512f(ZEXT416((uint)fStack_11c),auVar18);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_208.values[0].super_Tuple3<pbrt::Point3,_float>.y *
                                          IStack_118.high)),ZEXT416((uint)IStack_118.low),
                            ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_110),
                                ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar19 = vaddss_avx512f(ZEXT416((uint)fStack_10c),auVar18);
  auVar18 = vmulss_avx512f(ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.y),
                           ZEXT416((uint)FStack_104));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_108),
                                ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar20 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_100),
                                ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_208.values[0].super_Tuple3<pbrt::Point3,_float>.y *
                                          fStack_f4)),ZEXT416((uint)FStack_f8),
                            ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f0),
                                ZEXT416((uint)local_208.values[0].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  vaddss_avx512f(ZEXT416((uint)FStack_ec),auVar18);
  auVar18 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar21 = vaddss_avx512f(ZEXT416((uint)fStack_fc),auVar20);
  bVar13 = (bool)(bVar14 & !bVar13);
  auVar32._0_16_ = vdivss_avx512f(auVar17,auVar18);
  auVar34._0_16_ = vdivss_avx512f(auVar19,auVar18);
  auVar22 = vdivss_avx512f(auVar21,auVar18);
  auVar32._16_48_ = auVar47;
  auVar31._4_60_ = auVar32._4_60_;
  auVar31._0_4_ = (uint)bVar13 * auVar17._0_4_ + (uint)!bVar13 * auVar32._0_4_;
  auVar34._16_48_ = auVar47;
  auVar33._4_60_ = auVar34._4_60_;
  auVar33._0_4_ = (uint)bVar13 * auVar19._0_4_ + (uint)!bVar13 * auVar34._0_4_;
  auVar17 = vinsertps_avx512f(auVar31._0_16_,auVar33._0_16_,0x10);
  auVar26 = ZEXT416((uint)local_128._4_4_);
  auVar18 = vmulss_avx512f(auVar26,ZEXT416((uint)local_208.values[1].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_128._0_4_),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_128._8_4_),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar19 = vaddss_avx512f(ZEXT416((uint)fStack_11c),auVar18);
  auVar27 = ZEXT416((uint)IStack_118.high);
  auVar18 = vmulss_avx512f(auVar27,ZEXT416((uint)local_208.values[1].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)IStack_118.low),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_110),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar20 = vaddss_avx512f(ZEXT416((uint)fStack_10c),auVar18);
  auVar18 = vmulss_avx512f(ZEXT416((uint)FStack_104),
                           ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_108),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_100),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar23 = vaddss_avx512f(ZEXT416((uint)fStack_fc),auVar18);
  auVar65 = ZEXT416((uint)fStack_f4);
  auVar18 = vmulss_avx512f(auVar65,ZEXT416((uint)local_208.values[1].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f8),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f0),
                                ZEXT416((uint)local_208.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  vaddss_avx512f(ZEXT416((uint)FStack_ec),auVar18);
  auVar18 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar36._0_16_ = vdivss_avx512f(auVar19,auVar18);
  auVar38._0_16_ = vdivss_avx512f(auVar20,auVar18);
  auVar23 = vdivss_avx512f(auVar23,auVar18);
  auVar36._16_48_ = auVar47;
  auVar35._4_60_ = auVar36._4_60_;
  auVar35._0_4_ = auVar36._0_4_;
  auVar38._16_48_ = auVar47;
  auVar37._4_60_ = auVar38._4_60_;
  auVar37._0_4_ = auVar38._0_4_;
  auVar19 = vinsertps_avx512f(auVar35._0_16_,auVar37._0_16_,0x10);
  auVar18 = vmulss_avx512f(auVar26,ZEXT416((uint)local_208.values[2].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_128._0_4_),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_128._8_4_),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar20 = vaddss_avx512f(ZEXT416((uint)fStack_11c),auVar18);
  auVar18 = vmulss_avx512f(auVar27,ZEXT416((uint)local_208.values[2].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)IStack_118.low),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_110),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar24 = vaddss_avx512f(ZEXT416((uint)fStack_10c),auVar18);
  auVar18 = vmulss_avx512f(ZEXT416((uint)FStack_104),
                           ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_108),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_100),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar25 = vaddss_avx512f(ZEXT416((uint)fStack_fc),auVar18);
  auVar18 = vmulss_avx512f(auVar65,ZEXT416((uint)local_208.values[2].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f8),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f0),
                                ZEXT416((uint)local_208.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  vaddss_avx512f(ZEXT416((uint)FStack_ec),auVar18);
  auVar18 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar40._0_16_ = vdivss_avx512f(auVar20,auVar18);
  auVar42._0_16_ = vdivss_avx512f(auVar24,auVar18);
  auVar24 = vdivss_avx512f(auVar25,auVar18);
  auVar40._16_48_ = auVar47;
  auVar39._4_60_ = auVar40._4_60_;
  auVar39._0_4_ = auVar40._0_4_;
  auVar42._16_48_ = auVar47;
  auVar41._4_60_ = auVar42._4_60_;
  auVar41._0_4_ = auVar42._0_4_;
  auVar20 = vinsertps_avx512f(auVar39._0_16_,auVar41._0_16_,0x10);
  auVar18 = vmulss_avx512f(auVar26,ZEXT416((uint)local_208.values[3].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)local_128._0_4_));
  auVar25 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)local_128._8_4_));
  auVar18 = vmulss_avx512f(auVar27,ZEXT416((uint)local_208.values[3].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)IStack_118.low));
  auVar26 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)FStack_110));
  auVar18 = vmulss_avx512f(ZEXT416((uint)FStack_104),
                           ZEXT416((uint)local_208.values[3].super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)FStack_108));
  auVar27 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)local_208.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)FStack_100));
  auVar18 = vmulss_avx512f(auVar65,ZEXT416((uint)local_208.values[3].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f8),
                                ZEXT416((uint)local_208.values[3].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)FStack_f0),
                                ZEXT416((uint)local_208.values[3].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  vaddss_avx512f(ZEXT416((uint)FStack_ec),auVar18);
  auVar18 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar60 = auVar18._0_4_;
  fVar64 = (fStack_11c + auVar25._0_4_) / fVar60;
  fVar48 = (fStack_10c + auVar26._0_4_) / fVar60;
  auVar44._16_48_ = auVar47;
  auVar44._0_16_ = ZEXT416((uint)fVar64);
  auVar43._4_60_ = auVar44._4_60_;
  auVar43._0_4_ = fVar64;
  auVar46._16_48_ = auVar47;
  auVar46._0_16_ = ZEXT416((uint)fVar48);
  auVar45._4_60_ = auVar46._4_60_;
  auVar45._0_4_ = fVar48;
  auVar18 = vinsertps_avx(auVar43._0_16_,auVar45._0_16_,0x10);
  uVar15 = vmovlps_avx(auVar17);
  local_158.x = (float)uVar15;
  local_158.y = SUB84(uVar15,4);
  uVar8 = local_158._0_8_;
  local_158.z = (float)((uint)bVar13 * auVar21._0_4_ + (uint)!bVar13 * auVar22._0_4_);
  uVar5 = vmovlps_avx512f(auVar19);
  uStack_14c = (uint)uVar5;
  uStack_148 = (undefined4)((ulong)uVar5 >> 0x20);
  uStack_144 = auVar23._0_4_;
  uStack_140 = vmovlps_avx512f(auVar20);
  uVar9 = uStack_140;
  local_138 = auVar24._0_4_;
  uVar5 = vmovlps_avx(auVar18);
  local_134 = (uint)uVar5;
  uStack_130 = (undefined4)((ulong)uVar5 >> 0x20);
  local_12c = (fStack_fc + auVar27._0_4_) / fVar60;
  uVar4 = this->uMin;
  uVar6 = this->uMax;
  auVar50._4_4_ = uVar6;
  auVar50._0_4_ = uVar4;
  auVar50._8_8_ = 0;
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar55,auVar50);
  FVar1 = this->common->width[1];
  auVar27._4_4_ = FVar1;
  auVar27._0_4_ = FVar1;
  auVar27._8_4_ = FVar1;
  auVar27._12_4_ = FVar1;
  auVar17 = vmulps_avx512vl(auVar50,auVar27);
  FVar1 = this->common->width[0];
  auVar65._4_4_ = FVar1;
  auVar65._0_4_ = FVar1;
  auVar65._8_4_ = FVar1;
  auVar65._12_4_ = FVar1;
  auVar17 = vfmadd231ps_avx512vl(auVar17,auVar18,auVar65);
  auVar18 = vmovshdup_avx(auVar17);
  auVar18 = vmaxss_avx(auVar18,auVar17);
  local_158.x = (float)uVar15;
  auVar17 = vminss_avx(ZEXT416(uStack_14c),ZEXT416((uint)local_158.x));
  auVar19 = vminss_avx(ZEXT416(local_134),ZEXT416((uint)uStack_140));
  auVar17 = vminss_avx(auVar19,auVar17);
  auVar20 = vgatherdps_avx512vl(*(undefined4 *)((long)&local_158.x + extraout_RDX));
  auVar19 = vgatherdps_avx512vl(*(undefined4 *)((long)&local_158.x + extraout_RDX));
  fVar60 = auVar18._0_4_ * 0.5;
  fVar64 = auVar17._0_4_ - fVar60;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_180.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_180.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)local_180.d.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)local_180.d.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_180.d.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_180.d.super_Tuple3<pbrt::Vector3,_float>.z),auVar18)
  ;
  local_158._0_8_ = uVar8;
  uStack_140 = uVar9;
  if (auVar18._0_4_ < 0.0) {
    local_198 = ZEXT416((uint)fVar60);
    local_1c8._0_4_ = uStack_14c;
    local_1d8._0_4_ = local_158.x;
    local_20c = local_134;
    local_210 = (uint)uStack_140;
    local_214 = fVar64;
    local_1b8 = auVar20;
    local_1a8 = auVar19;
    fVar49 = sqrtf(auVar18._0_4_);
    fVar64 = local_214;
    auVar19 = local_1a8;
    auVar20 = local_1b8;
    uVar11 = local_1c8._0_4_;
    fVar48 = (float)local_1d8._0_4_;
    uVar2 = local_20c;
    uVar3 = local_210;
    fVar60 = (float)local_198._0_4_;
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    fVar49 = auVar18._0_4_;
    uVar11 = uStack_14c;
    fVar48 = local_158.x;
    uVar2 = local_134;
    uVar3 = (uint)uStack_140;
  }
  bVar13 = false;
  if (fVar64 <= 0.0) {
    auVar18 = vmaxss_avx(ZEXT416(uVar11),ZEXT416((uint)fVar48));
    auVar17 = vmaxss_avx(ZEXT416(uVar2),ZEXT416(uVar3));
    auVar18 = vmaxss_avx(auVar17,auVar18);
    bVar13 = false;
    if (0.0 <= fVar60 + auVar18._0_4_) {
      auVar21 = vmaxss_avx(ZEXT416((uint)(fVar49 * tMax)),ZEXT816(0) << 0x20);
      auVar22 = vminss_avx(ZEXT416((uint)(fVar49 * tMax)),ZEXT816(0) << 0x20);
      uVar7 = vcmpps_avx512vl(auVar20,auVar19,1);
      uVar15 = vcmpps_avx512vl(auVar19,auVar20,1);
      auVar18 = vpmovm2d_avx512vl(uVar15);
      auVar18 = vpshufd_avx(auVar18,0x4e);
      uVar16 = vpmovd2m_avx512vl(auVar18);
      auVar18 = vblendps_avx(auVar20,auVar19,6);
      auVar17 = vblendps_avx(auVar19,auVar20,6);
      auVar20 = vblendmps_avx512vl(auVar17,auVar18);
      bVar13 = (bool)((byte)uVar7 & 1);
      auVar28._0_4_ = (uint)bVar13 * auVar20._0_4_ | (uint)!bVar13 * auVar19._0_4_;
      bVar13 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar19._4_4_;
      bVar13 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar19._8_4_;
      bVar13 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar19._12_4_;
      auVar18 = vshufpd_avx(auVar18,auVar18,1);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      bVar13 = (bool)((byte)uVar16 & 1);
      auVar29._0_4_ = (uint)bVar13 * auVar18._0_4_ | (uint)!bVar13 * auVar17._0_4_;
      bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar13 * auVar18._4_4_ | (uint)!bVar13 * auVar17._4_4_;
      bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar13 * auVar18._8_4_ | (uint)!bVar13 * auVar17._8_4_;
      bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar13 * auVar18._12_4_ | (uint)!bVar13 * auVar17._12_4_;
      uVar7 = vcmpps_avx512vl(auVar28,auVar29,1);
      auVar18 = vblendps_avx(auVar28,auVar29,6);
      auVar17 = vblendps_avx(auVar29,auVar28,6);
      bVar13 = (bool)((byte)uVar7 & 1);
      auVar30._0_4_ = (float)((uint)bVar13 * auVar18._0_4_ | (uint)!bVar13 * auVar17._0_4_);
      bVar13 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar30._4_4_ = (float)((uint)bVar13 * auVar18._4_4_ | (uint)!bVar13 * auVar17._4_4_);
      bVar13 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar30._8_4_ = (float)((uint)bVar13 * auVar18._8_4_ | (uint)!bVar13 * auVar17._8_4_);
      bVar13 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar30._12_4_ = (float)((uint)bVar13 * auVar18._12_4_ | (uint)!bVar13 * auVar17._12_4_);
      auVar56._4_4_ = fVar60;
      auVar56._0_4_ = fVar60;
      auVar56._8_4_ = fVar60;
      auVar56._12_4_ = fVar60;
      auVar18 = vsubps_avx(auVar30,auVar56);
      auVar57._0_4_ = auVar30._0_4_ + fVar60;
      auVar57._4_4_ = auVar30._4_4_ + fVar60;
      auVar57._8_4_ = auVar30._8_4_ + fVar60;
      auVar57._12_4_ = auVar30._12_4_ + fVar60;
      auVar18 = vblendps_avx(auVar18,auVar57,6);
      auVar17 = vshufps_avx(ZEXT416(auVar22._0_4_),ZEXT416(auVar21._0_4_),0x11);
      uVar15 = vcmpps_avx512vl(auVar18,auVar17,2);
      uVar5 = vcmpps_avx512vl(auVar17,auVar18,2);
      auVar18 = vpmovm2d_avx512vl(uVar5);
      auVar17 = vpmovm2d_avx512vl(uVar15);
      auVar18 = vpblendd_avx2(auVar17,auVar18,6);
      uVar15 = vpmovd2m_avx512vl(auVar18);
      if ((~(ushort)uVar15 & 0xf) == 0) {
        auVar18 = (undefined1  [16])0x0;
        lVar12 = 0x20;
        auVar58._8_4_ = 0xc0000000;
        auVar58._0_8_ = 0xc0000000c0000000;
        auVar58._12_4_ = 0xc0000000;
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        do {
          auVar61._8_8_ = 0;
          auVar61._0_8_ =
               *(ulong *)((long)&local_180.o.super_Tuple3<pbrt::Point3,_float>.z + lVar12);
          auVar63._8_8_ = 0;
          auVar63._0_8_ =
               *(ulong *)((long)&local_180.d.super_Tuple3<pbrt::Vector3,_float>.z + lVar12);
          auVar17 = vfmadd132ps_fma(auVar63,auVar61,auVar58);
          uVar15 = *(undefined8 *)
                    ((long)&local_180.medium.
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                            .bits + lVar12);
          auVar62._0_4_ = auVar17._0_4_ + (float)uVar15;
          auVar62._4_4_ = auVar17._4_4_ + (float)((ulong)uVar15 >> 0x20);
          auVar62._8_4_ = auVar17._8_4_ + 0.0;
          auVar62._12_4_ = auVar17._12_4_ + 0.0;
          auVar17 = vandps_avx(auVar62,auVar59);
          auVar20 = vshufps_avx(auVar17,auVar17,0xf5);
          auVar19 = vfmadd213ss_fma(ZEXT416(*(uint *)(&local_180.field_0x1c + lVar12)),
                                    SUB6416(ZEXT464(0xc0000000),0),
                                    ZEXT416(*(uint *)((long)&local_180.d.
                                                             super_Tuple3<pbrt::Vector3,_float>.y +
                                                     lVar12)));
          auVar19 = vandps_avx(ZEXT416((uint)(auVar19._0_4_ +
                                             *(float *)((long)&local_158.x + lVar12))),auVar59);
          auVar17 = vmaxss_avx(auVar20,auVar17);
          auVar17 = vmaxss_avx(auVar19,auVar17);
          auVar18 = vmaxss_avx(auVar17,auVar18);
          lVar12 = lVar12 + 0xc;
        } while (lVar12 == 0x2c);
        auVar17 = vmaxss_avx(ZEXT416((uint)this->common->width[1]),
                             ZEXT416((uint)this->common->width[0]));
        iVar10 = Log2Int((auVar18._0_4_ * 8.485281) / (auVar17._0_4_ * 0.05 * 8.0));
        uVar11 = 10;
        if (iVar10 / 2 < 10) {
          uVar11 = iVar10 / 2;
        }
        local_68[1] = (Float)local_128._4_4_;
        local_68[0] = (Float)local_128._0_4_;
        aFStack_60[1] = fStack_11c;
        aFStack_60[0] = (Float)local_128._8_4_;
        local_a8._16_4_ = IStack_d8.low;
        local_a8._20_4_ = IStack_d8.high;
        aFStack_90[0] = aFStack_d0[0];
        aFStack_90[1] = aFStack_d0[1];
        aFStack_88[0] = aFStack_c8[0];
        aFStack_88[1] = aFStack_c8[1];
        aFStack_80[0] = aFStack_c0[0];
        aFStack_80[1] = aFStack_c0[1];
        aFStack_78[0] = aFStack_b8[0];
        aFStack_78[1] = aFStack_b8[1];
        aFStack_70[0] = aFStack_b0[0];
        aFStack_70[1] = aFStack_b0[1];
        IStack_58 = IStack_118;
        cp_01.n = 4;
        cp_01.ptr = (Point3<float> *)&local_158;
        bVar13 = RecursiveIntersect(this,&local_180,tMax,cp_01,(Transform *)local_a8,this->uMin,
                                    this->uMax,~((int)uVar11 >> 0x1f) & uVar11,si);
      }
      else {
        bVar13 = false;
      }
    }
  }
  return bVar13;
}

Assistant:

bool Curve::IntersectRay(const Ray &r, Float tMax,
                         pstd::optional<ShapeIntersection> *si) const {
#ifndef PBRT_IS_GPU_CODE
    ++nCurveTests;
#endif
    // Transform _Ray_ to curve's object space
    Ray ray = (*common->objectFromRender)(r);

    // Get object-space control points for curve segment, _cpObj_
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::span<const Point3f>(common->cpObj), uMin, uMax);

    // Project curve control points to plane perpendicular to ray
    Vector3f dx = Cross(ray.d, cpObj[3] - cpObj[0]);
    if (LengthSquared(dx) == 0) {
        Vector3f dy;
        CoordinateSystem(ray.d, &dx, &dy);
    }
    Transform rayFromObject = LookAt(ray.o, ray.o + ray.d, dx);
    pstd::array<Point3f, 4> cp = {rayFromObject(cpObj[0]), rayFromObject(cpObj[1]),
                                  rayFromObject(cpObj[2]), rayFromObject(cpObj[3])};

    // Test ray against bound of projected control points
    Float maxWidth = std::max(Lerp(uMin, common->width[0], common->width[1]),
                              Lerp(uMax, common->width[0], common->width[1]));
    Bounds3f curveBounds = Union(Bounds3f(cp[0], cp[1]), Bounds3f(cp[2], cp[3]));
    curveBounds = Expand(curveBounds, 0.5f * maxWidth);
    Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
    if (!Overlaps(rayBounds, curveBounds))
        return false;

    // Compute refinement depth for curve, _maxDepth_
    Float L0 = 0;
    for (int i = 0; i < 2; ++i)
        L0 = std::max(
            L0, std::max(std::max(std::abs(cp[i].x - 2 * cp[i + 1].x + cp[i + 2].x),
                                  std::abs(cp[i].y - 2 * cp[i + 1].y + cp[i + 2].y)),
                         std::abs(cp[i].z - 2 * cp[i + 1].z + cp[i + 2].z)));

    Float eps = std::max(common->width[0], common->width[1]) * .05f;  // width / 20
    // Compute log base 4 by dividing log2 in half.
    int r0 = Log2Int(1.41421356237f * 6.f * L0 / (8.f * eps)) / 2;
    int maxDepth = Clamp(r0, 0, 10);

    // Recursively test for ray--curve intersection
    pstd::span<const Point3f> cpSpan(cp);
    return RecursiveIntersect(ray, tMax, cpSpan, Inverse(rayFromObject), uMin, uMax,
                              maxDepth, si);
}